

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall
r_exec::IPGMContext::getMember
          (IPGMContext *this,void **object,uint64_t *view_oid,ObjectType *object_type,
          int16_t *member_index)

{
  Atom *pAVar1;
  Code *pCVar2;
  void **ppvVar3;
  ulong *puVar4;
  ObjectType *pOVar5;
  char cVar6;
  byte bVar7;
  uint16_t uVar8;
  uint16_t index;
  int16_t iVar9;
  uint uVar10;
  Group *pGVar11;
  uint16_t i;
  ulong uVar12;
  allocator local_139;
  IPGMContext local_138;
  IPGMContext local_108;
  Code *local_d8;
  View *pVStack_d0;
  void **local_c8;
  ulong *local_c0;
  ObjectType *local_b8;
  undefined1 local_b0 [32];
  Code *local_90;
  View *pVStack_88;
  string local_80 [32];
  IPGMContext local_60;
  
  cVar6 = r_code::Atom::getDescriptor();
  if (cVar6 == -0x7c) {
    pAVar1 = (this->super__Context).code;
    local_d8 = this->object;
    pVStack_d0 = this->view;
    local_108.super__Context.index = r_code::Atom::asIndex();
    local_108.super__Context.overlay = (this->super__Context).overlay;
    local_108.super__Context.data = (this->super__Context).data;
    local_108.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    local_108.object = local_d8;
    local_108.view = pVStack_d0;
    local_108.super__Context.code = pAVar1;
    cVar6 = r_code::Atom::getDescriptor();
    if (cVar6 == -0x40) {
      getChild((IPGMContext *)local_b0,&local_108,1);
      local_d8 = (Code *)member_index;
      local_c8 = object;
      local_c0 = view_oid;
      local_b8 = object_type;
      operator*(&local_138,(IPGMContext *)local_b0);
      uVar8 = getChildrenCount(&local_108);
      for (uVar12 = 2; uVar12 < uVar8; uVar12 = uVar12 + 1) {
        cVar6 = r_code::Atom::getDescriptor();
        if (cVar6 == -0x6f) {
          local_138.super__Context.code = (Atom *)&((local_138.view)->super_View).field_0x28;
          local_138.super__Context.index = 0;
          local_138.super__Context.data = VIEW;
        }
        else {
          index = r_code::Atom::asIndex();
          getChild(&local_60,&local_138,index);
          operator*((IPGMContext *)local_b0,&local_60);
          local_138.object = local_90;
          local_138.view = pVStack_88;
          local_138.super__Context.code = (Atom *)local_b0._16_8_;
          local_138.super__Context.index = local_b0._24_2_;
          local_138.super__Context.data = local_b0._28_4_;
        }
      }
      bVar7 = r_code::Atom::getDescriptor();
      pOVar5 = local_b8;
      puVar4 = local_c0;
      ppvVar3 = local_c8;
      pCVar2 = local_d8;
      uVar10 = bVar7 - 0xc1;
      if (uVar10 < 0xe) {
        if ((0x3f0cU >> (uVar10 & 0x1f) & 1) == 0) {
          if ((0x83U >> (uVar10 & 0x1f) & 1) == 0) goto LAB_001730d6;
          if (local_138.super__Context.data == VALUE_ARRAY) {
            std::__cxx11::string::string(local_80,"IPGMContext",&local_139);
            std::__cxx11::string::string((string *)local_b0,local_80);
            DebugStream::DebugStream((DebugStream *)&local_60,(string *)local_b0);
            std::__cxx11::string::~string((string *)local_b0);
            DebugStream::operator<<((DebugStream *)&local_60,"This will never work, aborting");
            DebugStream::~DebugStream((DebugStream *)&local_60);
            std::__cxx11::string::~string(local_80);
            r_code::Atom::trace();
            exit(0);
          }
          pGVar11 = View::get_host(local_138.view);
          *ppvVar3 = pGVar11;
          *puVar4 = (ulong)*(uint *)(local_138.super__Context.code +
                                    (ulong)local_138.super__Context.index * 4 + 0x30);
          *pOVar5 = TYPE_VIEW;
        }
        else {
          *local_b8 = TYPE_OBJECT;
          *local_c8 = local_138.object;
        }
        iVar9 = r_code::Atom::asIndex();
        *(int16_t *)pCVar2 = iVar9;
        return;
      }
LAB_001730d6:
      *local_c8 = (void *)0x0;
      *local_b8 = TYPE_UNDEFINED;
      return;
    }
  }
  *object = (void *)0x0;
  *object_type = TYPE_UNDEFINED;
  *member_index = 0;
  return;
}

Assistant:

void IPGMContext::getMember(void *&object, uint64_t &view_oid, ObjectType &object_type, int16_t &member_index) const
{
    if ((*this)[0].getDescriptor() != Atom::I_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext cptr = IPGMContext(this->object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data); // dereference manually (1 offset) to retain the cptr as is.

    if (cptr[0].getDescriptor() != Atom::C_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext c = *cptr.getChild(1); // this, vl_ptr, value_ptr or rptr.
    uint16_t atom_count = cptr.getChildrenCount();

    for (uint16_t i = 2; i < atom_count; ++i) { // stop before the last iptr.
        if (cptr[i].getDescriptor() == Atom::VIEW) {
            c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
        } else {
            c = *c.getChild(cptr[i].asIndex());
        }
    }

    // at this point, c is an iptr dereferenced to an object or a view; the next iptr holds the member index.
    // c is pointing at the first atom of an object or a view.
    switch (c[0].getDescriptor()) {
    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
        object_type = TYPE_OBJECT;
        object = c.getObject();
        break;

    case Atom::GROUP:
    case Atom::SET: // dynamically generated views can be sets.
    case Atom::S_SET: // views are always copied; set the object to the view's group on which to perform an operation for the view's oid.
        if (c.data == VALUE_ARRAY) {
            // FIXME: I'm not sure how this could ever have worked
            debug("IPGMContext") << "This will never work, aborting";
            c[VIEW_CODE_MAX_SIZE].trace();
            exit(0);
            object = (Group *)c[VIEW_CODE_MAX_SIZE].atom; // first reference of grp in a view stored in athe value array.
        } else {
            object = c.view->get_host();
        }

        view_oid = c[VIEW_OID].atom; // oid is hidden at the end of the view code; stored directly as a uint64.
        object_type = TYPE_VIEW;
        break;

    default: // atomic value or ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        return;
    }

    // get the index held by the last iptr.
    member_index = cptr[atom_count].asIndex();
}